

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O1

void Arguments_create_from_string(Arguments *args,char *argstring)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  size_t sVar4;
  char *__dest;
  char **ppcVar5;
  size_t sVar6;
  bool bVar7;
  
  if (args == (Arguments *)0x0) {
    __assert_fail("args != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/arguments.c"
                  ,0x3f,"void Arguments_create_from_string(Arguments *, const char *)");
  }
  if (argstring != (char *)0x0) {
    sVar4 = strlen(argstring);
    __dest = (char *)malloc(sVar4 + 1);
    args->argstring = __dest;
    memcpy(__dest,argstring,sVar4 + 1);
    ppcVar5 = (char **)malloc(sVar4 * 8);
    args->argv_unconsumed = ppcVar5;
    *ppcVar5 = __dest + sVar4;
    args->argc = 1;
    if (sVar4 != 0) {
      sVar6 = 0;
      bVar3 = true;
      do {
        cVar1 = args->argstring[sVar6];
        if ((cVar1 == ' ') || (cVar1 == '\t')) {
          args->argstring[sVar6] = '\0';
        }
        bVar7 = args->argstring[sVar6] == '\0';
        if (bVar3 && !bVar7) {
          iVar2 = args->argc;
          args->argv_unconsumed[iVar2] = args->argstring + sVar6;
          args->argc = iVar2 + 1;
        }
        sVar6 = sVar6 + 1;
        bVar3 = bVar7;
      } while (sVar4 != sVar6);
    }
    return;
  }
  __assert_fail("argstring != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/arguments.c"
                ,0x40,"void Arguments_create_from_string(Arguments *, const char *)");
}

Assistant:

void Arguments_create_from_string( Arguments*  args,
                                   const char* argstring )
{
  Assert( args != NULL );
  Assert( argstring != NULL );

  size_t len = strlen( argstring );

  args->argstring = (char*) malloc( (len+1) * sizeof( char ) );
  memcpy( args->argstring, argstring, len+1 );

  args->argv_unconsumed = (char**) malloc( len * sizeof( char* ) );

  args->argv_unconsumed[0] = & args->argstring[len];
  args->argc = 1;

  /*---Parse string, convert to args---*/
  Bool_t is_delim_prev = Bool_true;
  int i = 0;
  for( i=0; i<len; ++i )
  {
    if( args->argstring[i] == ' ' || args->argstring[i] == '\t' )
    {
      args->argstring[i] = 0;
    }
    Bool_t is_delim = args->argstring[i] == 0;
    if( is_delim_prev && ! is_delim )
    {
      args->argv_unconsumed[args->argc] = & args->argstring[i];
      args->argc++;
    }
    is_delim_prev = is_delim;
  }
}